

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEsop.c
# Opt level: O1

void Eso_ManCoverPrint(Eso_Man_t *p,Vec_Int_t *vEsop)

{
  int *piVar1;
  int iVar2;
  Hsh_VecMan_t *pHVar3;
  uint *__ptr;
  void *pvVar4;
  long lVar5;
  uint uVar6;
  uint uVar7;
  size_t sVar8;
  long lVar9;
  size_t __size;
  uint uVar10;
  
  if (vEsop->nSize == 0) {
    puts("Const 0");
    return;
  }
  uVar6 = p->nVars;
  uVar10 = uVar6 + 4;
  __ptr = (uint *)malloc(0x10);
  uVar7 = 0x10;
  if (0xe < uVar6 + 3) {
    uVar7 = uVar10;
  }
  __ptr[1] = 0;
  *__ptr = uVar7;
  if (uVar7 == 0) {
    pvVar4 = (void *)0x0;
  }
  else {
    pvVar4 = malloc((long)(int)uVar7);
  }
  __size = (size_t)(int)uVar6;
  *(void **)(__ptr + 2) = pvVar4;
  if ((int)uVar7 < (int)uVar6) {
    if (pvVar4 == (void *)0x0) {
      pvVar4 = malloc(__size);
    }
    else {
      pvVar4 = realloc(pvVar4,__size);
    }
    *(void **)(__ptr + 2) = pvVar4;
    *__ptr = uVar6;
  }
  __ptr[1] = uVar6;
  if (0 < (int)uVar6) {
    memset(*(void **)(__ptr + 2),0x2d,(ulong)uVar6);
  }
  uVar7 = *__ptr;
  if (uVar6 == uVar7) {
    if ((int)uVar7 < 0x10) {
      if (*(void **)(__ptr + 2) == (void *)0x0) {
        pvVar4 = malloc(0x10);
      }
      else {
        pvVar4 = realloc(*(void **)(__ptr + 2),0x10);
      }
      sVar8 = 0x10;
    }
    else {
      sVar8 = (ulong)uVar7 * 2;
      if ((int)sVar8 <= (int)uVar7) goto LAB_006d1395;
      if (*(void **)(__ptr + 2) == (void *)0x0) {
        pvVar4 = malloc(sVar8);
      }
      else {
        pvVar4 = realloc(*(void **)(__ptr + 2),sVar8);
      }
    }
    *(void **)(__ptr + 2) = pvVar4;
    *__ptr = (uint)sVar8;
  }
LAB_006d1395:
  pvVar4 = *(void **)(__ptr + 2);
  uVar7 = (uint)(__size + 1);
  __ptr[1] = uVar7;
  *(undefined1 *)((long)pvVar4 + __size) = 0x20;
  uVar6 = *__ptr;
  if (uVar7 == uVar6) {
    if ((int)uVar6 < 0x10) {
      if (pvVar4 == (void *)0x0) {
        pvVar4 = malloc(0x10);
      }
      else {
        pvVar4 = realloc(pvVar4,0x10);
      }
      sVar8 = 0x10;
    }
    else {
      sVar8 = (ulong)uVar6 * 2;
      if ((int)sVar8 <= (int)uVar6) goto LAB_006d13ff;
      if (pvVar4 == (void *)0x0) {
        pvVar4 = malloc(sVar8);
      }
      else {
        pvVar4 = realloc(pvVar4,sVar8);
      }
    }
    *(void **)(__ptr + 2) = pvVar4;
    *__ptr = (uint)sVar8;
  }
LAB_006d13ff:
  pvVar4 = *(void **)(__ptr + 2);
  uVar7 = (uint)(__size + 2);
  __ptr[1] = uVar7;
  *(undefined1 *)((long)pvVar4 + __size + 1) = 0x31;
  uVar6 = *__ptr;
  if (uVar7 == uVar6) {
    if ((int)uVar6 < 0x10) {
      if (pvVar4 == (void *)0x0) {
        pvVar4 = malloc(0x10);
      }
      else {
        pvVar4 = realloc(pvVar4,0x10);
      }
      sVar8 = 0x10;
    }
    else {
      sVar8 = (ulong)uVar6 * 2;
      if ((int)sVar8 <= (int)uVar6) goto LAB_006d1469;
      if (pvVar4 == (void *)0x0) {
        pvVar4 = malloc(sVar8);
      }
      else {
        pvVar4 = realloc(pvVar4,sVar8);
      }
    }
    *(void **)(__ptr + 2) = pvVar4;
    *__ptr = (uint)sVar8;
  }
LAB_006d1469:
  pvVar4 = *(void **)(__ptr + 2);
  uVar7 = (uint)(__size + 3);
  __ptr[1] = uVar7;
  *(undefined1 *)((long)pvVar4 + __size + 2) = 10;
  uVar6 = *__ptr;
  if (uVar7 == uVar6) {
    if ((int)uVar6 < 0x10) {
      if (pvVar4 == (void *)0x0) {
        pvVar4 = malloc(0x10);
      }
      else {
        pvVar4 = realloc(pvVar4,0x10);
      }
      sVar8 = 0x10;
    }
    else {
      sVar8 = (ulong)uVar6 * 2;
      if ((int)sVar8 <= (int)uVar6) goto LAB_006d14d3;
      if (pvVar4 == (void *)0x0) {
        pvVar4 = malloc(sVar8);
      }
      else {
        pvVar4 = realloc(pvVar4,sVar8);
      }
    }
    *(void **)(__ptr + 2) = pvVar4;
    *__ptr = (uint)sVar8;
  }
LAB_006d14d3:
  pvVar4 = *(void **)(__ptr + 2);
  __ptr[1] = uVar10;
  *(undefined1 *)((long)pvVar4 + __size + 3) = 0;
  if (vEsop->nSize < 1) {
    __assert_fail("Vec_IntSize(vEsop) > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaEsop.c"
                  ,0x80,"void Eso_ManCoverPrint(Eso_Man_t *, Vec_Int_t *)");
  }
  if (0 < vEsop->nSize) {
    lVar9 = 0;
    do {
      uVar6 = vEsop->pArray[lVar9];
      if (uVar6 == p->Cube1) {
        printf("%s",pvVar4);
      }
      else {
        if ((int)uVar6 < 0) {
          __assert_fail("iCube >= 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaEsop.c"
                        ,0x30,"Vec_Int_t *Eso_ManCube(Eso_Man_t *, int)");
        }
        pHVar3 = p->pHash;
        if (pHVar3->vMap->nSize <= (int)uVar6) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                        ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        iVar2 = pHVar3->vMap->pArray[uVar6];
        if (((long)iVar2 < 0) || (pHVar3->vData->nSize <= iVar2)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                        ,0x1af,"int *Vec_IntEntryP(Vec_Int_t *, int)");
        }
        piVar1 = pHVar3->vData->pArray + iVar2;
        iVar2 = *piVar1;
        (pHVar3->vTemp).nCap = iVar2;
        (pHVar3->vTemp).nSize = iVar2;
        (pHVar3->vTemp).pArray = piVar1 + 2;
        if (0 < iVar2) {
          lVar5 = 0;
          do {
            uVar6 = (pHVar3->vTemp).pArray[lVar5];
            if ((int)uVar6 < 0) goto LAB_006d1676;
            if ((int)uVar10 <= (int)(uVar6 >> 1)) goto LAB_006d1695;
            *(byte *)((long)pvVar4 + (ulong)(uVar6 >> 1)) = (byte)uVar6 & 1 ^ 0x31;
            lVar5 = lVar5 + 1;
          } while (lVar5 < (pHVar3->vTemp).nSize);
        }
        printf("%s",pvVar4);
        if (0 < (pHVar3->vTemp).nSize) {
          lVar5 = 0;
          do {
            uVar6 = (pHVar3->vTemp).pArray[lVar5];
            if ((int)uVar6 < 0) {
LAB_006d1676:
              __assert_fail("Lit >= 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                            ,0xf2,"int Abc_Lit2Var(int)");
            }
            uVar6 = uVar6 >> 1;
            if ((int)uVar10 <= (int)uVar6) {
LAB_006d1695:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecStr.h"
                            ,0x186,"void Vec_StrWriteEntry(Vec_Str_t *, int, char)");
            }
            *(undefined1 *)((long)pvVar4 + (ulong)uVar6) = 0x2d;
            lVar5 = lVar5 + 1;
          } while (lVar5 < (pHVar3->vTemp).nSize);
        }
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 < vEsop->nSize);
  }
  putchar(10);
  if (pvVar4 != (void *)0x0) {
    free(pvVar4);
    __ptr[2] = 0;
    __ptr[3] = 0;
  }
  free(__ptr);
  return;
}

Assistant:

void Eso_ManCoverPrint( Eso_Man_t * p, Vec_Int_t * vEsop )
{
    Vec_Str_t * vStr;
    Vec_Int_t * vCube;
    int i, k, Lit, Cube;
    if ( Vec_IntSize(vEsop) == 0 )
    {
        printf( "Const 0\n" );
        return;
    }
    vStr = Vec_StrAlloc( p->nVars + 4 );
    Vec_StrFill( vStr, p->nVars, '-' );
    Vec_StrPush( vStr, ' ' );
    Vec_StrPush( vStr, '1' );
    Vec_StrPush( vStr, '\n' );
    Vec_StrPush( vStr, '\0' );
    assert( Vec_IntSize(vEsop) > 0 );
    Vec_IntForEachEntry( vEsop, Cube, i )
    {
        if ( Cube == p->Cube1 )
            printf( "%s", Vec_StrArray(vStr) );
        else 
        {
            vCube = Eso_ManCube( p, Cube );
            Vec_IntForEachEntry( vCube, Lit, k )
                Vec_StrWriteEntry( vStr, Abc_Lit2Var(Lit), (char)(Abc_LitIsCompl(Lit)?'0':'1') );
            printf( "%s", Vec_StrArray(vStr) );
            Vec_IntForEachEntry( vCube, Lit, k )
                Vec_StrWriteEntry( vStr, Abc_Lit2Var(Lit), '-' );
        }
    }
    printf( "\n" );
    Vec_StrFree( vStr );
}